

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O1

ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>
testing::ValuesIn<(anonymous_namespace)::nonUniformTileConfigParam,6ul>
          (anon_struct_524_5_7b11162c_for__M_head_impl (*array) [6])

{
  anon_struct_524_5_7b11162c_for__M_head_impl *__cur;
  undefined8 *puVar1;
  void *__dest;
  undefined8 *puVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam> PVar3;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = &PTR__ValuesInIteratorRangeGenerator_01059060;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  __dest = operator_new(0xc48);
  puVar1[1] = __dest;
  puVar1[3] = (long)__dest + 0xc48;
  memcpy(__dest,::(anonymous_namespace)::nonUniformTileConfigParams,0xc48);
  puVar1[2] = (long)__dest + 0xc48;
  *(undefined8 **)*array = puVar1;
  ((anon_struct_524_5_7b11162c_for__M_head_impl *)((long)array + 0))->tile_widths[0] = 0;
  ((anon_struct_524_5_7b11162c_for__M_head_impl *)((long)array + 0))->tile_widths[1] = 0;
  puVar2 = (undefined8 *)operator_new(0x18);
  puVar2[1] = 0x100000001;
  *puVar2 = &PTR___Sp_counted_base_01059128;
  puVar2[2] = puVar1;
  *(undefined8 **)(*array)[0].tile_widths = puVar2;
  PVar3.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar3.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)array;
  return (ParamGenerator<(anonymous_namespace)::nonUniformTileConfigParam>)
         PVar3.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::nonUniformTileConfigParam>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ParamGenerator<T> ValuesIn(const T (&array)[N]) {
  return ValuesIn(array, array + N);
}